

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O3

bool CoreML::hasDefaultValueForOptionalInputs(Model *model)

{
  Rep *pRVar1;
  ModelDescription *pMVar2;
  undefined8 *puVar3;
  ArrayFeatureType *pAVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  
  pMVar2 = model->description_;
  if (pMVar2 == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  pRVar1 = (pMVar2->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  lVar6 = (long)(pMVar2->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar6 != 0) {
    lVar7 = 0;
    do {
      puVar3 = *(undefined8 **)(*(long *)((long)ppvVar5 + lVar7) + 0x20);
      if (puVar3 == (undefined8 *)0x0) {
        puVar3 = &Specification::_FeatureType_default_instance_;
      }
      if (*(char *)(puVar3 + 2) == '\x01') {
        if (*(int *)((long)puVar3 + 0x24) == 5) {
          pAVar4 = (ArrayFeatureType *)puVar3[3];
        }
        else {
          pAVar4 = Specification::ArrayFeatureType::default_instance();
        }
        if (((ulong)pAVar4->_oneof_case_[1] < 0x3e) &&
           ((0x2008020000000000U >> ((ulong)pAVar4->_oneof_case_[1] & 0x3f) & 1) != 0)) {
          return true;
        }
      }
      lVar7 = lVar7 + 8;
    } while (lVar6 * 8 != lVar7);
  }
  return false;
}

Assistant:

inline const ::CoreML::Specification::ModelDescription& Model::description() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.Model.description)
  return description_ != NULL ? *description_
                         : *::CoreML::Specification::ModelDescription::internal_default_instance();
}